

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

void pbrt::ply::parse(string *fileName,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *pos,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *nor,
                     vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *tex,
                     vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *idx)

{
  byte bVar1;
  _Alloc_hider _Var2;
  size_type __new_size;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *pvVar3;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *pvVar4;
  size_type __new_size_00;
  char *__s1;
  byte bVar5;
  int iVar6;
  uint uVar7;
  p_ply ply;
  p_ply_element element;
  p_ply_property ptVar8;
  undefined8 uVar9;
  undefined4 extraout_var_00;
  undefined7 uVar12;
  runtime_error *prVar11;
  _Alloc_hider property_name;
  bool bVar13;
  char *pname;
  long instance_count;
  char *name;
  uint local_d4;
  byte *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  uint local_a0;
  undefined4 local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  string *local_88;
  size_type local_80;
  ulong local_78;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *local_70;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_68;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *local_60;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_58;
  size_type local_50;
  byte *local_48;
  size_type local_40;
  char *local_38;
  ulong uVar10;
  undefined4 extraout_var;
  
  local_68 = nor;
  local_60 = tex;
  local_58 = pos;
  ply = ply_open((fileName->_M_dataplus)._M_p,(p_ply_error_cb)0x0,0,(void *)0x0);
  if (ply == (p_ply)0x0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c0,"Couldn\'t open PLY file ",fileName);
    std::runtime_error::runtime_error(prVar11,local_c0._M_dataplus._M_p);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_88 = fileName;
  local_70 = idx;
  iVar6 = ply_read_header(ply);
  if (iVar6 == 0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c0,"Unable to read the header of PLY file ",local_88);
    std::runtime_error::runtime_error(prVar11,local_c0._M_dataplus._M_p);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  element = ply_get_next_element(ply,(p_ply_element)0x0);
  if (element != (p_ply_element)0x0) {
    local_48 = (byte *)0x0;
    property_name._M_p = (pointer)0x0;
    local_c8 = (byte *)0x0;
    local_78 = 0;
    uVar7 = 0;
    local_d4 = 0;
    local_50 = 0;
    local_80 = 0;
    do {
      ply_get_element_info(element,&local_38,(long *)&local_40);
      __s1 = local_38;
      iVar6 = strcmp(local_38,"vertex");
      if (iVar6 == 0) {
        local_80 = local_40;
        ptVar8 = ply_get_next_property(element,(p_ply_property)0x0);
        if (ptVar8 == (p_ply_property)0x0) {
LAB_0013a8cf:
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_c0,local_88,": Vertex coordinate property not found!");
          std::runtime_error::runtime_error(prVar11,(string *)&local_c0);
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_8c = 0;
        bVar13 = false;
        local_a0 = 0;
        local_9c = 0;
        bVar5 = 0;
        local_94 = 0;
        local_98 = 0;
        local_90 = 0;
        do {
          ply_get_property_info
                    (ptVar8,(char **)&local_c0,(e_ply_type *)0x0,(e_ply_type *)0x0,(e_ply_type *)0x0
                    );
          _Var2._M_p = local_c0._M_dataplus._M_p;
          bVar1 = *local_c0._M_dataplus._M_p;
          uVar12 = (undefined7)
                   ((ulong)((long)&switchD_0013a53c::switchdataD_0014fe2c +
                           (long)(int)(&switchD_0013a53c::switchdataD_0014fe2c)[bVar1 - 0x6e]) >> 8)
          ;
          switch((uint)bVar1) {
          case 0x6e:
            if ((local_c0._M_dataplus._M_p[1] == 0x78) && (local_c0._M_dataplus._M_p[2] == 0)) {
              bVar5 = 1;
            }
            else if ((local_c0._M_dataplus._M_p[1] == 0x79) && (local_c0._M_dataplus._M_p[2] == 0))
            {
              local_9c = (undefined4)CONCAT71(uVar12,1);
            }
            else {
              if ((local_c0._M_dataplus._M_p[1] != 0x7a) || (local_c0._M_dataplus._M_p[2] != 0))
              goto switchD_0013a53c_caseD_6f;
              local_a0 = (uint)CONCAT71(uVar12,1);
            }
            break;
          default:
switchD_0013a53c_caseD_6f:
            iVar6 = strcmp(local_c0._M_dataplus._M_p,"texture_u");
            if (iVar6 != 0) {
              uVar7 = strcmp(_Var2._M_p,"texture_s");
              uVar10 = (ulong)uVar7;
              if (uVar7 != 0) {
                if (((bVar1 != 0x74) && (bVar1 != 0x76)) || (_Var2._M_p[1] != 0)) {
                  uVar7 = strcmp(_Var2._M_p,"texture_v");
                  uVar10 = (ulong)uVar7;
                  if (uVar7 != 0) {
                    uVar7 = strcmp(_Var2._M_p,"texture_t");
                    uVar10 = (ulong)uVar7;
                    if (uVar7 != 0) break;
                  }
                }
                local_8c = (uint)CONCAT71((int7)(uVar10 >> 8),1);
                property_name._M_p = _Var2._M_p;
                break;
              }
            }
            local_c8 = (byte *)_Var2._M_p;
            bVar13 = true;
            break;
          case 0x73:
          case 0x75:
            if (local_c0._M_dataplus._M_p[1] != 0) goto switchD_0013a53c_caseD_6f;
            bVar13 = true;
            local_c8 = (byte *)local_c0._M_dataplus._M_p;
            break;
          case 0x78:
            if (local_c0._M_dataplus._M_p[1] != 0) goto switchD_0013a53c_caseD_6f;
            local_90 = (uint)CONCAT71(uVar12,1);
            break;
          case 0x79:
            if (local_c0._M_dataplus._M_p[1] != 0) goto switchD_0013a53c_caseD_6f;
            local_98 = (uint)CONCAT71(uVar12,1);
            break;
          case 0x7a:
            if (local_c0._M_dataplus._M_p[1] != 0) goto switchD_0013a53c_caseD_6f;
            local_94 = (uint)CONCAT71(uVar12,1);
          }
          ptVar8 = ply_get_next_property(element,ptVar8);
        } while (ptVar8 != (p_ply_property)0x0);
        local_d4 = local_a0 & 0xff;
        if ((bVar5 & (byte)local_9c) == 0) {
          local_d4 = 0;
        }
        uVar7 = local_8c & 0xff;
        if (!bVar13) {
          uVar7 = 0;
        }
        if ((((local_90 & 1) == 0) || ((local_98 & 1) == 0)) || ((local_94 & 1) == 0))
        goto LAB_0013a8cf;
      }
      else {
        iVar6 = strcmp(__s1,"face");
        if (iVar6 == 0) {
          local_50 = local_40;
          for (ptVar8 = ply_get_next_property(element,(p_ply_property)0x0);
              ptVar8 != (p_ply_property)0x0; ptVar8 = ply_get_next_property(element,ptVar8)) {
            ply_get_property_info
                      (ptVar8,(char **)&local_c0,(e_ply_type *)0x0,(e_ply_type *)0x0,
                       (e_ply_type *)0x0);
            _Var2._M_p = local_c0._M_dataplus._M_p;
            iVar6 = strcmp(local_c0._M_dataplus._M_p,"vertex_index");
            uVar9 = CONCAT44(extraout_var,iVar6);
            if (iVar6 == 0) {
LAB_0013a47b:
              local_78 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
              local_48 = (byte *)_Var2._M_p;
            }
            else {
              iVar6 = strcmp(_Var2._M_p,"vertex_indices");
              uVar9 = CONCAT44(extraout_var_00,iVar6);
              if (iVar6 == 0) goto LAB_0013a47b;
            }
          }
        }
      }
      element = ply_get_next_element(ply,element);
      __new_size_00 = local_50;
      __new_size = local_80;
    } while (element != (p_ply_element)0x0);
    if ((local_80 != 0) && (local_50 != 0)) {
      std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize(local_58,local_80);
      if ((local_d4 & 1) != 0) {
        std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize
                  (local_68,__new_size);
      }
      if ((uVar7 & 1) != 0) {
        std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::resize
                  (local_60,local_80);
      }
      if ((local_78 & 1) != 0) {
        std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize
                  (local_70,__new_size_00);
      }
      pvVar3 = local_58;
      ply_set_read_cb(ply,"vertex","x",rply_vertex_callback_vec3,
                      (local_58->
                      super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                      _M_impl.super__Vector_impl_data._M_start,0);
      ply_set_read_cb(ply,"vertex","y",rply_vertex_callback_vec3,
                      &((pvVar3->
                        super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                        _M_impl.super__Vector_impl_data._M_start)->y,0);
      ply_set_read_cb(ply,"vertex","z",rply_vertex_callback_vec3,
                      &((pvVar3->
                        super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                        _M_impl.super__Vector_impl_data._M_start)->z,0);
      pvVar3 = local_68;
      if ((local_d4 & 1) != 0) {
        ply_set_read_cb(ply,"vertex","nx",rply_vertex_callback_vec3,
                        (local_68->
                        super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                        _M_impl.super__Vector_impl_data._M_start,0);
        ply_set_read_cb(ply,"vertex","ny",rply_vertex_callback_vec3,
                        &((pvVar3->
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->y,0);
        ply_set_read_cb(ply,"vertex","nz",rply_vertex_callback_vec3,
                        &((pvVar3->
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->z,0);
      }
      pvVar4 = local_60;
      if ((uVar7 & 1) != 0) {
        ply_set_read_cb(ply,"vertex",(char *)local_c8,rply_vertex_callback_vec2,
                        (local_60->
                        super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>).
                        _M_impl.super__Vector_impl_data._M_start,0);
        ply_set_read_cb(ply,"vertex",property_name._M_p,rply_vertex_callback_vec2,
                        &((pvVar4->
                          super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->y,0);
      }
      if ((local_78 & 1) != 0) {
        ply_set_read_cb(ply,"face",(char *)local_48,rply_face_callback,
                        (local_70->
                        super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>).
                        _M_impl.super__Vector_impl_data._M_start,0);
      }
      iVar6 = ply_read(ply);
      ply_close(ply);
      if (iVar6 != 0) {
        return;
      }
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_c0,local_88,": unable to read the contents of PLY file");
      std::runtime_error::runtime_error(prVar11,(string *)&local_c0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c0,local_88,": PLY file is invalid! No face/vertex elements found!");
  std::runtime_error::runtime_error(prVar11,(string *)&local_c0);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse(const std::string &fileName,
      std::vector<vec3f> &pos,
      std::vector<vec3f> &nor,
      std::vector<vec2f> &tex,
      std::vector<vec3i> &idx)
    {
      p_ply ply = ply_open(fileName.c_str(), nullptr, 0, nullptr);
      if (!ply)
        throw std::runtime_error(std::string("Couldn't open PLY file " + fileName).c_str());

      if (!ply_read_header(ply))
        throw std::runtime_error(std::string("Unable to read the header of PLY file " + fileName).c_str());

      long vertex_count = 0;
      long face_count = 0;
      bool has_normals = false;
      bool has_uvs = false;
      bool has_indices = false;
      const char* tex_coord_u_name = nullptr;
      const char* tex_coord_v_name = nullptr;
      const char* vertex_indices_name = nullptr;

      // Inspect structure of the PLY file.
      p_ply_element element = nullptr;
      while ((element = ply_get_next_element(ply, element)) != nullptr) {
        const char* name;
        long instance_count;
        ply_get_element_info(element, &name, &instance_count);

        // Check for vertex element.
        if (strcmp(name, "vertex") == 0) {
          vertex_count = instance_count;

          bool has_position_components[3] = {false};
          bool has_normal_components[3] = {false};
          bool has_uv_components[2] = {false};
         
          // Inspect vertex properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);

            if (!strcmp(pname, "x"))
              has_position_components[0] = true;
            else if (!strcmp(pname, "y"))
              has_position_components[1] = true;
            else if (!strcmp(pname, "z"))
              has_position_components[2] = true;
            else if (!strcmp(pname, "nx"))
              has_normal_components[0] = true;
            else if (!strcmp(pname, "ny"))
              has_normal_components[1] = true;
            else if (!strcmp(pname, "nz"))
              has_normal_components[2] = true;
            else if (!strcmp(pname, "u") || !strcmp(pname, "s") || !strcmp(pname, "texture_u") || !strcmp(pname, "texture_s")) {
              has_uv_components[0] = true;
              tex_coord_u_name = pname;
            }
            else if (!strcmp(pname, "v") || !strcmp(pname, "t") || !strcmp(pname, "texture_v") || !strcmp(pname, "texture_t")) {
              has_uv_components[1] = true;
              tex_coord_v_name = pname;
            }
          }

          if (!(has_position_components[0] && has_position_components[1] && has_position_components[2]))
            throw std::runtime_error(fileName + ": Vertex coordinate property not found!");

          has_normals = has_normal_components[0] && has_normal_components[1] && has_normal_components[2];
          has_uvs = has_uv_components[0] && has_uv_components[1];
        }

        // Check for face element.
        else if (strcmp(name, "face") == 0) {
          face_count = instance_count;

          // Inspect face properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);
            if (!strcmp(pname, "vertex_index") || !strcmp(pname, "vertex_indices")) {
              has_indices = true;
              vertex_indices_name = pname;
            }
          }
        }
      }

      if (vertex_count == 0 || face_count == 0)
        throw std::runtime_error(fileName + ": PLY file is invalid! No face/vertex elements found!");

      pos.resize(vertex_count);
      if (has_normals)
        nor.resize(vertex_count);
      if (has_uvs)
        tex.resize(vertex_count);
      if (has_indices)
        idx.resize(face_count);

      // Set callbacks to process the PLY properties.
      ply_set_read_cb(ply, "vertex", "x", rply_vertex_callback_vec3, &pos[0].x, 0);
      ply_set_read_cb(ply, "vertex", "y", rply_vertex_callback_vec3, &pos[0].y, 0);
      ply_set_read_cb(ply, "vertex", "z", rply_vertex_callback_vec3, &pos[0].z, 0);

      if (has_normals) {
        ply_set_read_cb(ply, "vertex", "nx", rply_vertex_callback_vec3, &nor[0].x, 0);
        ply_set_read_cb(ply, "vertex", "ny", rply_vertex_callback_vec3, &nor[0].y, 0);
        ply_set_read_cb(ply, "vertex", "nz", rply_vertex_callback_vec3, &nor[0].z, 0);
      }

      if (has_uvs) {
        ply_set_read_cb(ply, "vertex", tex_coord_u_name, rply_vertex_callback_vec2, &tex[0].x, 0);
        ply_set_read_cb(ply, "vertex", tex_coord_v_name, rply_vertex_callback_vec2, &tex[0].y, 0);
      }

      if (has_indices) {
        ply_set_read_cb(ply, "face", vertex_indices_name, rply_face_callback, &idx[0].x, 0);
      }

      // Read ply file.
      if (!ply_read(ply)) {
        ply_close(ply);
        throw std::runtime_error(fileName + ": unable to read the contents of PLY file");
      }
      ply_close(ply);
    }